

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86_avx::create_pipeline(Convolution_x86_avx *this,Option *opt)

{
  Mat *this_00;
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  char cVar7;
  undefined4 uVar8;
  undefined4 uVar16;
  pointer pMVar9;
  void *pvVar10;
  size_t sVar11;
  int *piVar12;
  Allocator *pAVar13;
  size_t sVar14;
  void *pvVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  byte bVar26;
  byte bVar27;
  int k_6;
  uint _h;
  int iVar28;
  int iVar29;
  int iVar30;
  Layer *pLVar31;
  undefined4 *puVar32;
  long lVar33;
  void *pvVar34;
  undefined4 *puVar35;
  byte bVar36;
  undefined4 uVar37;
  pointer pMVar38;
  undefined1 (*pauVar39) [32];
  void *pvVar40;
  bool bVar41;
  int p;
  byte bVar42;
  uint uVar43;
  uint uVar44;
  pointer pMVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  undefined1 (*pauVar49) [32];
  void *pvVar50;
  int k;
  uint uVar51;
  undefined4 *puVar52;
  long lVar53;
  long lVar54;
  uint uVar55;
  _func_int **pp_Var56;
  long lVar57;
  int p_1;
  uint uVar58;
  long lVar59;
  int k_7;
  uint uVar60;
  int iVar61;
  _func_int **pp_Var62;
  void *pvVar63;
  int k_3;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  void *pvVar67;
  uint uVar68;
  long lVar69;
  long lVar70;
  void *pvVar71;
  uint uVar72;
  int iVar73;
  long lVar74;
  int i;
  _func_int **pp_Var75;
  long lVar76;
  void *pvVar77;
  int k_4;
  int iVar78;
  long lVar79;
  ulong uVar80;
  void *pvVar81;
  int iVar82;
  int iVar83;
  ulong uVar84;
  long lVar85;
  ulong uVar86;
  void *pvVar87;
  undefined4 *puVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  void *local_240;
  void *local_230;
  void *local_228;
  void *local_210;
  void *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  ParamDict pd;
  undefined1 local_158 [8];
  int local_150;
  Allocator *local_148;
  int iStack_140;
  int iStack_13c;
  size_t sStack_138;
  int local_130 [2];
  size_t local_128;
  void *local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  size_t local_110;
  int local_108;
  Allocator *local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  size_t sStack_f0;
  int local_e8;
  size_t local_e0;
  ulong local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  int TILE_K;
  int TILE_M;
  ulong local_a0;
  ParamDict pd_5;
  size_t local_88;
  int local_80;
  Allocator *local_78;
  int local_70;
  int iStack_6c;
  undefined8 uStack_68;
  int local_60;
  size_t local_58;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar31 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar31->_vptr_Layer[2])(pLVar31,&pd);
    break;
  case 2:
    pLVar31 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    (*pLVar31->_vptr_Layer[2])(pLVar31,&pd);
    break;
  case 3:
    pLVar31 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar31->_vptr_Layer[2])(pLVar31,&pd);
    break;
  case 4:
    pLVar31 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar31->_vptr_Layer[2])(pLVar31,&pd);
    break;
  case 5:
    pLVar31 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar31->_vptr_Layer[2])(pLVar31,&pd);
    break;
  case 6:
    pLVar31 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar31->_vptr_Layer[2])(pLVar31,&pd);
    break;
  default:
    pLVar31 = (Layer *)0x0;
    goto LAB_001e3d33;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar31->_vptr_Layer[4])(pLVar31,opt);
LAB_001e3d33:
  this->activation = pLVar31;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar8 = (this->super_Convolution).kernel_w;
  uVar16 = (this->super_Convolution).kernel_h;
  auVar89._4_4_ = uVar16;
  auVar89._0_4_ = uVar8;
  uVar46 = (long)(this->super_Convolution).weight_data_size / (long)(int)(uVar16 * uVar8);
  uVar55 = (this->super_Convolution).num_output;
  uVar46 = (long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 | uVar46 & 0xffffffff) /
           (long)(int)uVar55;
  if (uVar8 == uVar16 && opt->use_packing_layout == false) {
    auVar17._0_4_ = (this->super_Convolution).dilation_w;
    auVar17._4_4_ = (this->super_Convolution).dilation_h;
    auVar17._8_4_ = (this->super_Convolution).stride_w;
    auVar17._12_4_ = (this->super_Convolution).stride_h;
    auVar18 = vshufps_avx(auVar17,auVar17,0x50);
    auVar94._8_4_ = 1;
    auVar94._0_8_ = 0x100000001;
    auVar94._12_4_ = 1;
    auVar18 = vblendps_avx(auVar94,auVar18,2);
    auVar94 = vpcmpeqd_avx(auVar94,auVar94);
    auVar17 = vpcmpeqd_avx(auVar17,auVar18);
    auVar17 = vpblendw_avx(auVar17,auVar17 ^ auVar94,3);
    auVar94 = auVar94 & ~auVar17;
    if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar94 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar94[0xf]) {
      pLVar31 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar31;
      ParamDict::ParamDict(&pd_5);
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      ParamDict::set(&pd_5,2,1);
      ParamDict::set(&pd_5,0xc,1);
      ParamDict::set(&pd_5,3,1);
      ParamDict::set(&pd_5,0xd,1);
      ParamDict::set(&pd_5,4,0);
      ParamDict::set(&pd_5,0xe,0);
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_128 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_158 = SUB128(ZEXT812(0),4);
        local_150 = 0;
        local_148 = (Allocator *)0x0;
        iStack_140 = 0;
        local_130[0] = 0;
        iStack_13c = pd.d._4_4_;
        sStack_138 = (size_t)local_158;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar12 = (this->super_Convolution).weight_data.refcount;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar12 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar12,0);
          pd.d._4_4_ = (int)((ulong)piVar12 >> 0x20);
          local_158 = (undefined1  [8])(this->super_Convolution).weight_data.elemsize;
          local_150 = (this->super_Convolution).weight_data.elempack;
          local_148 = (this->super_Convolution).weight_data.allocator;
          uVar24 = (this->super_Convolution).weight_data.dims;
          uVar25 = (this->super_Convolution).weight_data.w;
          sStack_138._0_4_ = (this->super_Convolution).weight_data.h;
          sStack_138._4_4_ = (this->super_Convolution).weight_data.d;
          local_130[0] = (this->super_Convolution).weight_data.c;
          local_128 = (this->super_Convolution).weight_data.cstep;
          iStack_140 = uVar24;
          iStack_13c = uVar25;
        }
        pLVar31 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar31->_vptr_Layer[3])(pLVar31,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_148 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_148->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_128 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_158 = SUB128(ZEXT812(0),4);
        local_150 = 0;
        local_148 = (Allocator *)0x0;
        iStack_140 = 0;
        local_130[0] = 0;
        iStack_13c = pd.d._4_4_;
        sStack_138 = (size_t)local_158;
        sStack_f0 = (size_t)local_158;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar12 = (this->super_Convolution).weight_data.refcount;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar12 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar12,0);
          pd.d._4_4_ = (int)((ulong)piVar12 >> 0x20);
          local_158 = (undefined1  [8])(this->super_Convolution).weight_data.elemsize;
          local_150 = (this->super_Convolution).weight_data.elempack;
          local_148 = (this->super_Convolution).weight_data.allocator;
          uVar20 = (this->super_Convolution).weight_data.dims;
          uVar21 = (this->super_Convolution).weight_data.w;
          sStack_138._0_4_ = (this->super_Convolution).weight_data.h;
          sStack_138._4_4_ = (this->super_Convolution).weight_data.d;
          local_130[0] = (this->super_Convolution).weight_data.c;
          local_128 = (this->super_Convolution).weight_data.cstep;
          iStack_140 = uVar20;
          iStack_13c = uVar21;
        }
        local_e0 = 0;
        local_e8 = 0;
        uStack_f4 = 0;
        uStack_f8 = 0;
        local_100 = (Allocator *)0x0;
        local_108 = 0;
        uStack_114 = 0;
        uStack_118 = 0;
        local_120 = (void *)0x0;
        local_110 = sStack_f0;
        if ((Mat *)&local_120 != &(this->super_Convolution).bias_data) {
          piVar12 = (this->super_Convolution).bias_data.refcount;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          local_120 = (this->super_Convolution).bias_data.data;
          piVar12 = (this->super_Convolution).bias_data.refcount;
          uStack_118 = SUB84(piVar12,0);
          uStack_114 = (undefined4)((ulong)piVar12 >> 0x20);
          local_110 = (this->super_Convolution).bias_data.elemsize;
          local_108 = (this->super_Convolution).bias_data.elempack;
          local_100 = (this->super_Convolution).bias_data.allocator;
          uVar22 = (this->super_Convolution).bias_data.dims;
          uVar23 = (this->super_Convolution).bias_data.w;
          sStack_f0._0_4_ = (this->super_Convolution).bias_data.h;
          sStack_f0._4_4_ = (this->super_Convolution).bias_data.d;
          local_e8 = (this->super_Convolution).bias_data.c;
          local_e0 = (this->super_Convolution).bias_data.cstep;
          uStack_f8 = uVar22;
          uStack_f4 = uVar23;
        }
        pLVar31 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar31->_vptr_Layer[3])(pLVar31,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar79 = 0x48;
        do {
          piVar12 = *(int **)((long)&pd.d + lVar79);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (*(long **)((long)&local_148 + lVar79) == (long *)0x0) {
                free(*(void **)((long)&pd._vptr_ParamDict + lVar79));
              }
              else {
                (**(code **)(**(long **)((long)&local_148 + lVar79) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_128 + lVar79) = 0;
          *(undefined8 *)((long)&pd.d + lVar79 + 4) = 0;
          *(undefined8 *)(local_158 + lVar79 + 4) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar79) = 0;
          *(undefined8 *)((long)&pd.d + lVar79) = 0;
          *(undefined4 *)((long)local_130 + lVar79) = 0;
          *(undefined8 *)((long)&iStack_140 + lVar79) = 0;
          *(undefined8 *)((long)local_130 + lVar79 + -8) = 0;
          lVar79 = lVar79 + -0x48;
        } while (lVar79 != -0x48);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      if (opt->lightmode == true) {
        piVar12 = (this->super_Convolution).weight_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pAVar13 = (this->super_Convolution).weight_data.allocator;
            if (pAVar13 == (Allocator *)0x0) {
              free((this->super_Convolution).weight_data.data);
            }
            else {
              (*pAVar13->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Convolution).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Convolution).weight_data.elemsize + 4) = 0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  if (opt->use_packing_layout == false) {
    lVar79 = 1;
    lVar1 = lVar79;
  }
  else {
    lVar79 = (ulong)((uVar46 & 3) == 0) * 3 + 1;
    if ((uVar46 & 7) == 0) {
      lVar79 = 8;
    }
    lVar1 = (ulong)((uVar55 & 3) == 0) * 3 + 1;
    if ((uVar55 & 7) == 0) {
      lVar1 = 8;
    }
  }
  bVar42 = opt->use_winograd23_convolution;
  _h = (uint)uVar46;
  if ((((bool)bVar42 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar41 = false;
  }
  else {
    bVar41 = 8 < (int)uVar55 || 8 < (int)_h;
  }
  auVar18._0_4_ = (this->super_Convolution).dilation_w;
  auVar18._4_4_ = (this->super_Convolution).dilation_h;
  auVar18._8_4_ = (this->super_Convolution).stride_w;
  auVar18._12_4_ = (this->super_Convolution).stride_h;
  auVar89._8_8_ = 0;
  auVar89 = vpunpcklqdq_avx(auVar89,auVar18);
  if (((auVar89 != _DAT_00539000) || ((this->super_Convolution).stride_w != 1)) ||
     (((this->super_Convolution).stride_h != 1 ||
      ((opt->use_winograd_convolution == false || (!bVar41)))))) {
    iVar28 = get_cpu_level2_cache_size();
    uVar55 = (this->super_Convolution).num_output;
    uVar44 = (this->super_Convolution).kernel_w;
    uVar65 = (ulong)(int)uVar55;
    uVar72 = (this->super_Convolution).kernel_h;
    uVar58 = (this->super_Convolution).dilation_w;
    uVar43 = (this->super_Convolution).dilation_h;
    iVar82 = (this->super_Convolution).stride_w;
    iVar73 = (this->super_Convolution).stride_h;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar28 < (int)(uVar55 * uVar44 * uVar72 * uVar58 * uVar43 * iVar82 * iVar73 * _h * 8) ||
         (0x10 < (int)_h || 0x10 < (int)uVar55))) || (uVar72 == 1 && uVar44 == 1)) {
      uVar72 = uVar72 * uVar44;
      iVar82 = _h * uVar72;
      convolution_im2col_gemm_get_optimal_tile_mnk
                (uVar55,0,iVar82,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      local_d8 = (long)(int)(TILE_M + uVar55 + -1) / (long)TILE_M & 0xffffffff;
      if (opt->use_packing_layout == true) {
        uVar44 = (uint)((uVar46 & 3) == 0) * 3 + 1;
        if ((uVar46 & 7) == 0) {
          uVar44 = 8;
        }
      }
      else {
        uVar44 = 1;
      }
      local_128 = 0;
      this_00 = &(this->super_Convolution).weight_data;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_158 = (undefined1  [8])0x0;
      local_150 = 0;
      local_148 = (Allocator *)0x0;
      iStack_140 = 0;
      iStack_13c = 0;
      sStack_138._0_4_ = 0;
      sStack_138._4_4_ = 0;
      local_130[0] = 0;
      if (uVar72 == 1) {
        Mat::reshape((Mat *)&pd_5,this_00,iVar82,uVar55,(Allocator *)0x0);
        if (pd_5.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + 1;
          UNLOCK();
        }
        piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_148 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_148->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = SUB84(pd_5.d,0);
        pd.d._4_4_ = (int)((ulong)pd_5.d >> 0x20);
        local_158 = (undefined1  [8])local_88;
        local_150 = local_80;
        local_148 = local_78;
        iStack_140 = local_70;
        iStack_13c = iStack_6c;
        sStack_138 = uStack_68;
        local_130[0] = local_60;
        local_128 = local_58;
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_001e4a89;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_001e4a89;
        if (local_78 != (Allocator *)0x0) {
          (*local_78->_vptr_Allocator[3])();
          goto LAB_001e4a89;
        }
      }
      else {
        Mat::reshape((Mat *)&pd_5,this_00,uVar72,_h,uVar55,(Allocator *)0x0);
        uVar65 = 0;
        Mat::create((Mat *)&pd,iVar82,uVar55,4,(Allocator *)0x0);
        uVar46 = (ulong)uVar72;
        if ((int)uVar72 < 1) {
          uVar46 = uVar65;
        }
        uVar80 = 0;
        if (0 < (int)uVar55) {
          uVar80 = (ulong)uVar55;
        }
        for (; uVar65 != uVar80; uVar65 = uVar65 + 1) {
          pp_Var56 = (_func_int **)
                     ((long)iStack_13c * (long)local_158 * uVar65 + (long)pd._vptr_ParamDict);
          for (lVar79 = 0; lVar79 < (long)((long)(int)_h - (ulong)(uVar44 - 1));
              lVar79 = lVar79 + (ulong)uVar44) {
            pp_Var62 = (_func_int **)
                       ((iStack_6c * lVar79 + local_58 * uVar65) * local_88 +
                       (long)pd_5._vptr_ParamDict);
            for (uVar86 = 0; pp_Var75 = pp_Var62, uVar84 = (ulong)uVar44, uVar86 != uVar46;
                uVar86 = uVar86 + 1) {
              while (uVar84 != 0) {
                *(undefined4 *)pp_Var56 = *(undefined4 *)pp_Var75;
                pp_Var56 = (_func_int **)((long)pp_Var56 + 4);
                pp_Var75 = (_func_int **)((long)pp_Var75 + local_88 * (long)iStack_6c);
                uVar84 = uVar84 - 1;
              }
              pp_Var62 = (_func_int **)((long)pp_Var62 + 4);
            }
          }
        }
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_001e4a89;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_001e4a89;
        if (local_78 != (Allocator *)0x0) {
          (*local_78->_vptr_Allocator[3])();
          goto LAB_001e4a89;
        }
      }
      free(pd_5._vptr_ParamDict);
LAB_001e4a89:
      iVar73 = TILE_M;
      lVar79 = (long)TILE_M;
      local_1d0 = 4;
      Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,(iVar82 + TILE_K + -1) / TILE_K,
                  (int)((uVar55 - 1) + TILE_M) / TILE_M,4,(Allocator *)0x0);
      iVar28 = (int)local_d8;
      local_d8 = local_d8 & 0xffffffff;
      if (iVar28 < 1) {
        local_d8 = 0;
      }
      lVar1 = lVar79 * 4;
      local_1d8 = 0x1c;
      local_1e0 = 0x18;
      local_1e8 = 0x14;
      local_1b0 = 0x10;
      local_1b8 = 0xc;
      local_1c0 = 8;
      lVar57 = 0;
      uVar46 = 0;
      while (uVar65 = uVar46, uVar65 != local_d8) {
        uVar46 = uVar65 * lVar79;
        iVar28 = uVar55 - (int)uVar46;
        if (iVar73 < iVar28) {
          iVar28 = iVar73;
        }
        local_c0 = (void *)(long)TILE_K;
        local_c8 = (void *)CONCAT44(local_c8._4_4_,TILE_M);
        lVar69 = (long)iVar28;
        local_d0 = (void *)((long)local_c0 * 4);
        lVar66 = 0;
        for (uVar80 = 0; (long)uVar80 < (long)iVar82; uVar80 = uVar80 + (long)local_c0) {
          iVar28 = iVar82 - (int)uVar80;
          if (TILE_K < iVar28) {
            iVar28 = TILE_K;
          }
          sVar14 = (this->weight_sgemm_data).elemsize;
          pauVar49 = (undefined1 (*) [32])
                     ((long)(this->weight_sgemm_data).data +
                     (long)(this->weight_sgemm_data).w * sVar14 *
                     (long)(int)((long)((ulong)(uint)((int)uVar80 >> 0x1f) << 0x20 |
                                       uVar80 & 0xffffffff) / (long)TILE_K) +
                     (long)(int)((long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 |
                                       uVar46 & 0xffffffff) / (long)TILE_M) *
                     (this->weight_sgemm_data).cstep * sVar14);
          lVar33 = (long)iStack_13c;
          lVar54 = local_1d8 * lVar33 + lVar66;
          lVar47 = lVar33 * 0x20;
          lVar76 = local_1e0 * lVar33 + lVar66;
          lVar53 = local_1e8 * lVar33 + lVar66;
          local_208 = (void *)(local_1b0 * lVar33 + lVar66);
          lVar74 = local_1b8 * lVar33 + lVar66;
          local_230 = (void *)(local_1c0 * lVar33 + lVar66);
          lVar48 = local_1d0 * lVar33 + lVar66;
          lVar59 = lVar57 * lVar33 + lVar66;
          for (uVar86 = 0; (long)(uVar86 | 7) < lVar69; uVar86 = uVar86 + 8) {
            lVar85 = 0;
            lVar70 = 0;
            pauVar39 = pauVar49;
            for (iVar29 = 0; iVar29 + 7 < iVar28; iVar29 = iVar29 + 8) {
              auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + lVar59);
              auVar93 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + lVar48);
              auVar95 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + (long)local_230);
              auVar3 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + lVar74);
              auVar4 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + (long)local_208);
              auVar96 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + lVar53);
              auVar5 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + lVar76);
              auVar6 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar70 + lVar54);
              auVar19 = vunpcklps_avx(auVar2,auVar93);
              auVar93 = vunpckhps_avx(auVar2,auVar93);
              auVar2 = vunpcklps_avx(auVar95,auVar3);
              auVar95 = vunpckhps_avx(auVar95,auVar3);
              auVar97 = vunpcklps_avx(auVar4,auVar96);
              auVar3 = vunpckhps_avx(auVar4,auVar96);
              auVar98 = vunpcklps_avx(auVar5,auVar6);
              auVar4 = vunpckhps_avx(auVar5,auVar6);
              auVar96 = vunpcklpd_avx(auVar19,auVar2);
              auVar2 = vunpckhpd_avx(auVar19,auVar2);
              auVar5 = vunpcklpd_avx(auVar93,auVar95);
              auVar93 = vunpckhpd_avx(auVar93,auVar95);
              auVar6 = vunpcklpd_avx(auVar97,auVar98);
              auVar95 = vunpckhpd_avx(auVar97,auVar98);
              auVar19 = vunpcklpd_avx(auVar3,auVar4);
              auVar3 = vunpckhpd_avx(auVar3,auVar4);
              auVar97._16_16_ = auVar6._0_16_;
              auVar97._0_16_ = auVar96._0_16_;
              auVar98._16_16_ = auVar95._0_16_;
              auVar98._0_16_ = auVar2._0_16_;
              auVar99._16_16_ = auVar19._0_16_;
              auVar99._0_16_ = auVar5._0_16_;
              auVar100._16_16_ = auVar3._0_16_;
              auVar100._0_16_ = auVar93._0_16_;
              auVar4 = vperm2f128_avx(auVar96,auVar6,0x31);
              auVar2 = vperm2f128_avx(auVar2,auVar95,0x31);
              auVar95 = vperm2f128_avx(auVar5,auVar19,0x31);
              auVar93 = vperm2f128_avx(auVar93,auVar3,0x31);
              *(undefined1 (*) [32])(*pauVar49 + lVar70 * 8) = auVar97;
              *(undefined1 (*) [32])(pauVar49[1] + lVar70 * 8) = auVar98;
              *(undefined1 (*) [32])(pauVar49[2] + lVar70 * 8) = auVar99;
              *(undefined1 (*) [32])(pauVar49[3] + lVar70 * 8) = auVar100;
              *(undefined1 (*) [32])(pauVar49[4] + lVar70 * 8) = auVar4;
              *(undefined1 (*) [32])(pauVar49[5] + lVar70 * 8) = auVar2;
              *(undefined1 (*) [32])(pauVar49[6] + lVar70 * 8) = auVar95;
              *(undefined1 (*) [32])(pauVar49[7] + lVar70 * 8) = auVar93;
              pauVar39 = pauVar39 + 8;
              lVar70 = lVar70 + 0x20;
              lVar85 = lVar85 + 8;
            }
            for (; pauVar49 = pauVar39, (int)lVar85 < iVar28; lVar85 = lVar85 + 1) {
              puVar32 = (undefined4 *)((long)pd._vptr_ParamDict + lVar85 * 4 + lVar59);
              *(undefined4 *)*pauVar49 = *puVar32;
              *(undefined4 *)(*pauVar49 + 4) = puVar32[lVar33];
              *(undefined4 *)(*pauVar49 + 8) = puVar32[lVar33 * 2];
              *(undefined4 *)(*pauVar49 + 0xc) = puVar32[lVar33 * 3];
              *(undefined4 *)(*pauVar49 + 0x10) = puVar32[lVar33 * 4];
              *(undefined4 *)(*pauVar49 + 0x14) = puVar32[lVar33 * 5];
              *(undefined4 *)(*pauVar49 + 0x18) = puVar32[lVar33 * 6];
              *(undefined4 *)(*pauVar49 + 0x1c) = puVar32[lVar33 * 7];
              pauVar39 = pauVar49 + 1;
            }
            lVar54 = lVar54 + lVar47;
            lVar76 = lVar76 + lVar47;
            lVar53 = lVar53 + lVar47;
            local_208 = (void *)((long)local_208 + lVar47);
            lVar74 = lVar74 + lVar47;
            local_230 = (void *)((long)local_230 + lVar47);
            lVar48 = lVar48 + lVar47;
            lVar59 = lVar59 + lVar47;
          }
          lVar47 = lVar33 * 0x10;
          for (; (long)(uVar86 | 3) < lVar69; uVar86 = uVar86 + 4) {
            lVar53 = 0;
            pauVar39 = pauVar49;
            for (iVar29 = 0; iVar29 + 7 < iVar28; iVar29 = iVar29 + 8) {
              auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar53 + lVar59);
              auVar93 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar53 + lVar48);
              auVar95 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar53 + (long)local_230);
              auVar3 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar53 + lVar74);
              auVar4 = vunpcklps_avx(auVar2,auVar93);
              auVar93 = vunpckhps_avx(auVar2,auVar93);
              auVar2 = vunpcklps_avx(auVar95,auVar3);
              auVar95 = vunpckhps_avx(auVar95,auVar3);
              auVar3 = vunpcklpd_avx(auVar4,auVar2);
              auVar2 = vunpckhpd_avx(auVar4,auVar2);
              auVar4 = vunpcklpd_avx(auVar93,auVar95);
              auVar93 = vunpckhpd_avx(auVar93,auVar95);
              auVar95._16_16_ = auVar2._0_16_;
              auVar95._0_16_ = auVar3._0_16_;
              auVar96._16_16_ = auVar93._0_16_;
              auVar96._0_16_ = auVar4._0_16_;
              auVar2 = vperm2f128_avx(auVar3,auVar2,0x31);
              auVar93 = vperm2f128_avx(auVar4,auVar93,0x31);
              *(undefined1 (*) [32])(*pauVar49 + lVar53 * 4) = auVar95;
              *(undefined1 (*) [32])(pauVar49[1] + lVar53 * 4) = auVar96;
              *(undefined1 (*) [32])(pauVar49[2] + lVar53 * 4) = auVar2;
              *(undefined1 (*) [32])(pauVar49[3] + lVar53 * 4) = auVar93;
              pauVar39 = pauVar39 + 4;
              lVar53 = lVar53 + 0x20;
            }
            for (; iVar29 + 3 < iVar28; iVar29 = iVar29 + 4) {
              auVar89 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar53 + lVar59);
              auVar17 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar53 + lVar48);
              auVar18 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar53 + (long)local_230);
              auVar94 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar53 + lVar74);
              auVar90 = vpunpckldq_avx(auVar89,auVar17);
              auVar91 = vpunpckldq_avx(auVar18,auVar94);
              auVar89 = vpunpckhdq_avx(auVar89,auVar17);
              auVar17 = vpunpckhdq_avx(auVar18,auVar94);
              auVar94 = vpunpcklqdq_avx(auVar90,auVar91);
              auVar18 = vpunpckhqdq_avx(auVar90,auVar91);
              auVar90 = vpunpcklqdq_avx(auVar89,auVar17);
              auVar89 = vpunpckhqdq_avx(auVar89,auVar17);
              *(undefined1 (*) [16])(*pauVar49 + lVar53 * 4) = auVar94;
              *(undefined1 (*) [16])(*pauVar49 + lVar53 * 4 + 0x10) = auVar18;
              *(undefined1 (*) [16])(pauVar49[1] + lVar53 * 4) = auVar90;
              *(undefined1 (*) [16])(pauVar49[1] + lVar53 * 4 + 0x10) = auVar89;
              pauVar39 = pauVar39 + 2;
              lVar53 = lVar53 + 0x10;
            }
            for (; iVar29 < iVar28; iVar29 = iVar29 + 1) {
              *(undefined4 *)(*pauVar49 + lVar53 * 4) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar59);
              *(undefined4 *)(*pauVar49 + lVar53 * 4 + 4) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar48);
              *(undefined4 *)(*pauVar49 + lVar53 * 4 + 8) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + (long)local_230);
              *(undefined4 *)(*pauVar49 + lVar53 * 4 + 0xc) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 + lVar74);
              pauVar39 = (undefined1 (*) [32])(*pauVar39 + 0x10);
              lVar53 = lVar53 + 4;
            }
            lVar48 = lVar48 + lVar47;
            local_230 = (void *)((long)local_230 + lVar47);
            lVar74 = lVar74 + lVar47;
            lVar59 = lVar59 + lVar47;
            pauVar49 = pauVar39;
          }
          for (; (long)(uVar86 | 1) < lVar69; uVar86 = uVar86 + 2) {
            lVar53 = 0;
            lVar47 = 0;
            pauVar39 = pauVar49;
            for (iVar29 = 0; iVar29 + 7 < iVar28; iVar29 = iVar29 + 8) {
              auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar47 + lVar59);
              auVar93 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar47 + lVar48);
              auVar95 = vunpcklps_avx(auVar2,auVar93);
              auVar2 = vunpckhps_avx(auVar2,auVar93);
              auVar93._16_16_ = auVar2._0_16_;
              auVar93._0_16_ = auVar95._0_16_;
              auVar2 = vperm2f128_avx(auVar95,auVar2,0x31);
              *(undefined1 (*) [32])(*pauVar49 + lVar47 * 2) = auVar93;
              *(undefined1 (*) [32])(pauVar49[1] + lVar47 * 2) = auVar2;
              pauVar39 = pauVar39 + 2;
              lVar47 = lVar47 + 0x20;
              lVar53 = lVar53 + 8;
            }
            for (; iVar29 + 3 < iVar28; iVar29 = iVar29 + 4) {
              auVar89 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar47 + lVar59);
              auVar17 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar47 + lVar48);
              auVar18 = vpunpckldq_avx(auVar89,auVar17);
              auVar89 = vpunpckhdq_avx(auVar89,auVar17);
              *(undefined1 (*) [16])(*pauVar49 + lVar47 * 2) = auVar18;
              *(undefined1 (*) [16])(*pauVar49 + lVar47 * 2 + 0x10) = auVar89;
              pauVar39 = pauVar39 + 1;
              lVar47 = lVar47 + 0x10;
              lVar53 = lVar53 + 4;
            }
            for (; (int)lVar53 < iVar28; lVar53 = lVar53 + 1) {
              *(undefined4 *)*pauVar39 =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 * 4 + lVar59);
              *(undefined4 *)(*pauVar39 + 4) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar53 * 4 + lVar48);
              pauVar39 = (undefined1 (*) [32])(*pauVar39 + 8);
            }
            lVar59 = lVar59 + lVar33 * 8;
            lVar48 = lVar48 + lVar33 * 8;
            pauVar49 = pauVar39;
          }
          for (; (long)uVar86 < lVar69; uVar86 = uVar86 + 1) {
            pauVar39 = (undefined1 (*) [32])
                       ((long)pd._vptr_ParamDict + uVar80 * 4 + (uVar46 + uVar86) * lVar33 * 4);
            lVar47 = 0;
            for (iVar29 = 0; iVar29 + 7 < iVar28; iVar29 = iVar29 + 8) {
              *pauVar49 = *pauVar39;
              pauVar49 = pauVar49 + 1;
              pauVar39 = pauVar39 + 1;
              lVar47 = lVar47 + 8;
            }
            for (; iVar29 + 3 < iVar28; iVar29 = iVar29 + 4) {
              *(undefined1 (*) [16])*pauVar49 = *(undefined1 (*) [16])*pauVar39;
              pauVar49 = (undefined1 (*) [32])(*pauVar49 + 0x10);
              pauVar39 = (undefined1 (*) [32])(*pauVar39 + 0x10);
              lVar47 = lVar47 + 4;
            }
            for (; (int)lVar47 < iVar28; lVar47 = lVar47 + 1) {
              *(undefined4 *)*pauVar49 =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 * 4 + lVar59);
              pauVar49 = (undefined1 (*) [32])(*pauVar49 + 4);
            }
            lVar59 = lVar59 + lVar33 * 4;
          }
          lVar66 = lVar66 + (long)local_d0;
        }
        local_1d8 = local_1d8 + lVar1;
        local_1e0 = local_1e0 + lVar1;
        local_1e8 = local_1e8 + lVar1;
        local_1b0 = local_1b0 + lVar1;
        local_1b8 = local_1b8 + lVar1;
        local_1c0 = local_1c0 + lVar1;
        local_1d0 = local_1d0 + lVar1;
        lVar57 = lVar57 + lVar1;
        local_a0 = uVar65;
        uVar46 = uVar65 + 1;
      }
      piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_148 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_148->_vptr_Allocator[3])();
          }
        }
      }
      if (opt->lightmode != true) {
        return 0;
      }
      piVar12 = (this->super_Convolution).weight_data.refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          pAVar13 = (this->super_Convolution).weight_data.allocator;
          if (pAVar13 == (Allocator *)0x0) {
            free((this->super_Convolution).weight_data.data);
          }
          else {
            (*pAVar13->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_Convolution).weight_data.cstep = 0;
      *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
           (undefined1  [16])0x0;
      this_00->data = (void *)0x0;
      this_00->refcount = (int *)0x0;
      (this->super_Convolution).weight_data.dims = 0;
      (this->super_Convolution).weight_data.w = 0;
      (this->super_Convolution).weight_data.h = 0;
      (this->super_Convolution).weight_data.d = 0;
      (this->super_Convolution).weight_data.c = 0;
      return 0;
    }
    uVar51 = (uint)lVar79;
    uVar60 = (uint)lVar1;
    bVar41 = (uVar51 ^ 8) == 0 && (uVar60 ^ 8) == 0;
    if ((((iVar82 == 1 && uVar43 == 1) && ((uVar58 == 1 && uVar72 == 3) && (uVar44 == 3 && bVar41)))
         && iVar73 == 1) ||
       (iVar73 == 1 &&
        ((uVar43 == 1 && iVar82 == 1) && ((uVar72 == 2 && uVar58 == 1) && (bVar41 && uVar44 == 2))))
       ) {
LAB_001e4667:
      uVar72 = uVar72 * uVar44;
      uVar80 = 0;
      Mat::reshape((Mat *)&pd,&(this->super_Convolution).weight_data,uVar72,_h,uVar55,
                   (Allocator *)0x0);
      Mat::create(&this->weight_data_tm,uVar72,(int)_h / (int)uVar51,(int)uVar55 / (int)uVar60,
                  (ulong)(uVar60 * uVar51 * 4),uVar60 * uVar51,(Allocator *)0x0);
      pvVar10 = (this->weight_data_tm).data;
      sVar14 = (this->weight_data_tm).elemsize;
      sVar11 = (this->weight_data_tm).cstep;
      uVar46 = (ulong)uVar72;
      if ((int)uVar72 < 1) {
        uVar46 = uVar80;
      }
      for (; (long)uVar80 < (long)(uVar65 - (uVar60 - 1)); uVar80 = uVar80 + lVar1) {
        puVar32 = (undefined4 *)
                  ((long)(int)((long)((ulong)(uint)((int)uVar80 >> 0x1f) << 0x20 |
                                     uVar80 & 0xffffffff) / (long)(int)uVar60) * sVar14 * sVar11 +
                  (long)pvVar10);
        for (lVar57 = 0; lVar57 < (long)((long)(int)_h - (ulong)(uVar51 - 1));
            lVar57 = lVar57 + lVar79) {
          lVar66 = 0;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar69 = lVar57;
            for (lVar33 = 0; lVar33 != lVar79; lVar33 = lVar33 + 1) {
              puVar52 = (undefined4 *)
                        ((long)pd._vptr_ParamDict +
                        (iStack_13c * lVar69 + uVar80 * local_128) * (long)local_158 + lVar66);
              lVar47 = lVar1;
              while (bVar41 = lVar47 != 0, lVar47 = lVar47 + -1, bVar41) {
                *puVar32 = *puVar52;
                puVar32 = puVar32 + 1;
                puVar52 = (undefined4 *)((long)puVar52 + (long)local_158 * local_128);
              }
              lVar69 = lVar69 + 1;
            }
            lVar66 = lVar66 + 4;
          }
        }
      }
      piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_148 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_148->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      uVar43 = uVar43 ^ 1;
      uVar58 = uVar58 ^ 1;
      uVar64 = uVar72 ^ 3;
      uVar68 = uVar44 ^ 3;
      bVar41 = ((((uVar60 ^ 8) == 0 && (uVar51 ^ 1) == 0) && uVar68 == 0) &&
               (uVar64 == 0 && uVar58 == 0)) && uVar43 == 0;
      if (((iVar82 == 1 && bVar41) && iVar73 == 1) ||
         (((bVar41 && iVar82 == 2) && iVar73 == 2 ||
          (((iVar82 == 1 && uVar43 == 0) &&
           ((((uVar51 ^ 8) == 0 && uVar60 == 1) && uVar68 == 0) && (uVar64 == 0 && uVar58 == 0))) &&
           iVar73 == 1)))) goto LAB_001e4667;
      bVar41 = ((((uVar51 ^ 1) == 0 && uVar60 == 4) && uVar68 == 0) && (uVar64 == 0 && uVar58 == 0))
               && uVar43 == 0;
      if (((iVar82 == 1 && bVar41) && iVar73 == 1) || (bVar41 && (iVar82 == 2 && iVar73 == 2)))
      goto LAB_001e4667;
      uVar72 = uVar72 * uVar44;
      uVar44 = _h;
      if ((int)uVar55 < 8) {
        if ((int)uVar55 < 4) {
          if ((int)uVar55 < 2) {
            if ((int)_h < 8) {
              if ((int)_h < 4) {
                uVar58 = uVar72;
                if (1 < (int)_h) {
                  uVar58 = uVar72 * 2;
                  uVar44 = (_h & 1) + 1;
                }
              }
              else {
                uVar58 = uVar72 * 4;
                uVar44 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
              }
            }
            else {
              uVar58 = uVar72 * 8;
              uVar44 = (_h & 1) + (_h >> 3) + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
            }
          }
          else if ((int)_h < 8) {
            if ((int)_h < 4) {
              if (1 < (int)_h) {
                uVar58 = uVar72 * 4;
                uVar44 = (_h & 1) + 1;
                goto LAB_001e5921;
              }
              uVar55 = (uVar55 & 1) + 1;
              uVar58 = uVar72 * 2;
            }
            else {
              uVar55 = (uVar55 & 1) + 1;
              uVar58 = uVar72 * 8;
              uVar44 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
            }
          }
          else {
            uVar58 = uVar72 * 0x10;
            uVar44 = (_h & 1) + (_h >> 3) + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
LAB_001e5921:
            uVar55 = (uVar55 & 1) + 1;
          }
        }
        else {
          if ((int)_h < 8) {
            if ((int)_h < 4) {
              if ((int)_h < 2) {
                uVar58 = uVar72 * 4;
                uVar55 = (uVar55 & 1) + 1 + (uint)((uVar55 >> 1 & 1) != 0);
                goto LAB_001e5b2f;
              }
              uVar58 = uVar72 * 8;
              uVar44 = (_h & 1) + 1;
            }
            else {
              uVar58 = uVar72 * 0x10;
              uVar44 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
            }
          }
          else {
            uVar58 = uVar72 * 0x20;
            uVar44 = (_h & 1) + (_h >> 3) + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
          }
          uVar55 = (uVar55 & 1) + 1 + (uint)((uVar55 >> 1 & 1) != 0);
        }
LAB_001e5b2f:
        Mat::create(&this->weight_data_tm,uVar58,uVar44,uVar55,4,(Allocator *)0x0);
      }
      else {
        if ((int)_h < 8) {
          if ((int)_h < 4) {
            if ((int)_h < 2) {
              uVar58 = uVar72 * 8;
              uVar55 = (uVar55 & 1) + (uVar55 >> 3) + ((uint)(uVar65 >> 2) & 1) +
                       (uint)((uVar55 >> 1 & 1) != 0);
              goto LAB_001e5b2f;
            }
            uVar58 = uVar72 * 0x10;
            uVar44 = (_h & 1) + 1;
          }
          else {
            uVar58 = uVar72 * 0x20;
            uVar44 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
          }
          uVar55 = (uVar55 & 1) + (uVar55 >> 3) + ((uint)(uVar65 >> 2) & 1) +
                   (uint)((uVar55 >> 1 & 1) != 0);
          goto LAB_001e5b2f;
        }
        Mat::create(&this->weight_data_tm,uVar72 * 0x40,
                    (_h & 1) + (_h >> 3) + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0),
                    (uVar55 & 1) + (uVar55 >> 3) + ((uint)(uVar65 >> 2) & 1) +
                    (uint)((uVar55 >> 1 & 1) != 0),4,(Allocator *)0x0);
      }
      pvVar10 = (this->super_Convolution).weight_data.data;
      sVar14 = (this->weight_data_tm).elemsize;
      sVar11 = (this->weight_data_tm).cstep;
      pvVar15 = (this->weight_data_tm).data;
      local_a0 = (ulong)(int)uVar72;
      local_d8 = (ulong)(int)(uVar72 * 4);
      iVar82 = 0;
      uVar46 = 0;
      if (0 < (int)uVar72) {
        uVar46 = (ulong)uVar72;
      }
      lVar33 = (long)(int)(uVar72 * 2);
      iVar61 = uVar72 * _h;
      iVar30 = iVar61 * 8;
      iVar78 = iVar61 * 2;
      iVar83 = iVar61 * 3;
      local_1b0._0_4_ = iVar61 * 6;
      lVar69 = (long)(int)(uVar72 * 8) * 4;
      lVar79 = local_a0 * 4;
      iVar73 = iVar61 * 7;
      iVar28 = iVar61 * 5;
      iVar29 = iVar61 * 4;
      lVar1 = local_d8 * 4;
      lVar57 = lVar33 * 4;
      lVar66 = uVar46 * 4;
      for (uVar80 = 0; (long)(uVar80 | 7) < (long)uVar65; uVar80 = uVar80 + 8) {
        pvVar34 = (void *)((long)pvVar10 + (long)iVar82 * 4);
        pvVar40 = (void *)((long)pvVar10 + (long)iVar61 * 4);
        pvVar50 = (void *)((long)pvVar10 + (long)iVar78 * 4);
        pvVar63 = (void *)((long)pvVar10 + (long)iVar83 * 4);
        pvVar71 = (void *)((long)pvVar10 + (long)iVar29 * 4);
        pvVar77 = (void *)((long)pvVar10 + (long)iVar28 * 4);
        pvVar81 = (void *)((long)pvVar10 + (long)(int)local_1b0 * 4);
        pvVar87 = (void *)((long)pvVar10 + (long)iVar73 * 4);
        pvVar67 = (void *)((uVar80 >> 3) * sVar14 * sVar11 + (long)pvVar15);
        lVar47 = 0;
        local_240 = pvVar81;
        local_230 = pvVar87;
        local_228 = pvVar77;
        local_210 = pvVar63;
        local_208 = pvVar71;
        local_200 = pvVar50;
        local_1f8 = pvVar34;
        local_1f0 = pvVar40;
        for (uVar55 = 0; (int)(uVar55 | 7) < (int)_h; uVar55 = uVar55 + 8) {
          lVar48 = lVar47;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar53 = lVar48;
            for (lVar54 = 0; (int)lVar54 != 0x100; lVar54 = lVar54 + 0x20) {
              *(undefined4 *)((long)pvVar67 + lVar54) = *(undefined4 *)((long)pvVar34 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar54 + 4) = *(undefined4 *)((long)pvVar40 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar54 + 8) = *(undefined4 *)((long)pvVar50 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar54 + 0xc) =
                   *(undefined4 *)((long)pvVar63 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar54 + 0x10) =
                   *(undefined4 *)((long)pvVar71 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar54 + 0x14) =
                   *(undefined4 *)((long)pvVar77 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar54 + 0x18) =
                   *(undefined4 *)((long)pvVar81 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar54 + 0x1c) =
                   *(undefined4 *)((long)pvVar87 + lVar53);
              lVar53 = lVar53 + lVar79;
            }
            lVar48 = lVar48 + 4;
            pvVar67 = (void *)((long)pvVar67 + lVar54);
          }
          lVar47 = lVar47 + lVar69;
          local_1f8 = (void *)((long)local_1f8 + lVar69);
          local_1f0 = (void *)((long)local_1f0 + lVar69);
          local_200 = (void *)((long)local_200 + lVar69);
          local_210 = (void *)((long)local_210 + lVar69);
          local_208 = (void *)((long)local_208 + lVar69);
          local_228 = (void *)((long)local_228 + lVar69);
          local_240 = (void *)((long)local_240 + lVar69);
          local_230 = (void *)((long)local_230 + lVar69);
        }
        for (; (int)(uVar55 | 3) < (int)_h; uVar55 = uVar55 + 4) {
          pvVar34 = local_230;
          pvVar40 = local_240;
          pvVar50 = local_210;
          pvVar63 = local_228;
          pvVar71 = local_208;
          pvVar77 = local_1f8;
          pvVar81 = local_200;
          pvVar87 = local_1f0;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar47 = 0;
            for (lVar48 = 0; (int)lVar48 != 0x80; lVar48 = lVar48 + 0x20) {
              *(undefined4 *)((long)pvVar67 + lVar48) = *(undefined4 *)((long)pvVar77 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 4) = *(undefined4 *)((long)pvVar87 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 8) = *(undefined4 *)((long)pvVar81 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0xc) =
                   *(undefined4 *)((long)pvVar50 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x10) =
                   *(undefined4 *)((long)pvVar71 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x14) =
                   *(undefined4 *)((long)pvVar63 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x18) =
                   *(undefined4 *)((long)pvVar40 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x1c) =
                   *(undefined4 *)((long)pvVar34 + lVar47);
              lVar47 = lVar47 + lVar79;
            }
            pvVar77 = (void *)((long)pvVar77 + 4);
            pvVar87 = (void *)((long)pvVar87 + 4);
            pvVar81 = (void *)((long)pvVar81 + 4);
            pvVar50 = (void *)((long)pvVar50 + 4);
            pvVar71 = (void *)((long)pvVar71 + 4);
            pvVar63 = (void *)((long)pvVar63 + 4);
            pvVar40 = (void *)((long)pvVar40 + 4);
            pvVar34 = (void *)((long)pvVar34 + 4);
            pvVar67 = (void *)((long)pvVar67 + lVar48);
          }
          local_1f8 = (void *)((long)local_1f8 + lVar1);
          local_1f0 = (void *)((long)local_1f0 + lVar1);
          local_200 = (void *)((long)local_200 + lVar1);
          local_210 = (void *)((long)local_210 + lVar1);
          local_208 = (void *)((long)local_208 + lVar1);
          local_228 = (void *)((long)local_228 + lVar1);
          local_240 = (void *)((long)local_240 + lVar1);
          local_230 = (void *)((long)local_230 + lVar1);
        }
        for (; (int)(uVar55 | 1) < (int)_h; uVar55 = uVar55 + 2) {
          pvVar34 = local_230;
          pvVar40 = local_240;
          pvVar50 = local_210;
          pvVar63 = local_228;
          pvVar71 = local_208;
          pvVar77 = local_1f8;
          pvVar81 = local_200;
          pvVar87 = local_1f0;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar47 = 0;
            for (lVar48 = 0; (int)lVar48 != 0x40; lVar48 = lVar48 + 0x20) {
              *(undefined4 *)((long)pvVar67 + lVar48) = *(undefined4 *)((long)pvVar77 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 4) = *(undefined4 *)((long)pvVar87 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 8) = *(undefined4 *)((long)pvVar81 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0xc) =
                   *(undefined4 *)((long)pvVar50 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x10) =
                   *(undefined4 *)((long)pvVar71 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x14) =
                   *(undefined4 *)((long)pvVar63 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x18) =
                   *(undefined4 *)((long)pvVar40 + lVar47);
              *(undefined4 *)((long)pvVar67 + lVar48 + 0x1c) =
                   *(undefined4 *)((long)pvVar34 + lVar47);
              lVar47 = lVar47 + lVar79;
            }
            pvVar77 = (void *)((long)pvVar77 + 4);
            pvVar87 = (void *)((long)pvVar87 + 4);
            pvVar81 = (void *)((long)pvVar81 + 4);
            pvVar50 = (void *)((long)pvVar50 + 4);
            pvVar71 = (void *)((long)pvVar71 + 4);
            pvVar63 = (void *)((long)pvVar63 + 4);
            pvVar40 = (void *)((long)pvVar40 + 4);
            pvVar34 = (void *)((long)pvVar34 + 4);
            pvVar67 = (void *)((long)pvVar67 + lVar48);
          }
          local_1f8 = (void *)((long)local_1f8 + lVar57);
          local_1f0 = (void *)((long)local_1f0 + lVar57);
          local_200 = (void *)((long)local_200 + lVar57);
          local_210 = (void *)((long)local_210 + lVar57);
          local_208 = (void *)((long)local_208 + lVar57);
          local_228 = (void *)((long)local_228 + lVar57);
          local_240 = (void *)((long)local_240 + lVar57);
          local_230 = (void *)((long)local_230 + lVar57);
        }
        for (; (int)uVar55 < (int)_h; uVar55 = uVar55 + 1) {
          pvVar34 = pvVar67;
          for (lVar47 = 0; lVar66 != lVar47; lVar47 = lVar47 + 4) {
            *(undefined4 *)((long)pvVar67 + lVar47 * 8) = *(undefined4 *)((long)local_1f8 + lVar47);
            *(undefined4 *)((long)pvVar67 + lVar47 * 8 + 4) =
                 *(undefined4 *)((long)local_1f0 + lVar47);
            *(undefined4 *)((long)pvVar67 + lVar47 * 8 + 8) =
                 *(undefined4 *)((long)local_200 + lVar47);
            *(undefined4 *)((long)pvVar67 + lVar47 * 8 + 0xc) =
                 *(undefined4 *)((long)local_210 + lVar47);
            *(undefined4 *)((long)pvVar67 + lVar47 * 8 + 0x10) =
                 *(undefined4 *)((long)local_208 + lVar47);
            *(undefined4 *)((long)pvVar67 + lVar47 * 8 + 0x14) =
                 *(undefined4 *)((long)local_228 + lVar47);
            *(undefined4 *)((long)pvVar67 + lVar47 * 8 + 0x18) =
                 *(undefined4 *)((long)local_240 + lVar47);
            *(undefined4 *)((long)pvVar67 + lVar47 * 8 + 0x1c) =
                 *(undefined4 *)((long)local_230 + lVar47);
            pvVar34 = (void *)((long)pvVar34 + 0x20);
          }
          pvVar67 = pvVar34;
        }
        iVar82 = iVar82 + iVar30;
        iVar61 = iVar61 + iVar30;
        iVar78 = iVar78 + iVar30;
        iVar83 = iVar83 + iVar30;
        local_1b0._0_4_ = (int)local_1b0 + iVar30;
        iVar73 = iVar73 + iVar30;
        iVar28 = iVar28 + iVar30;
        iVar29 = iVar29 + iVar30;
      }
      pvVar10 = (this->super_Convolution).weight_data.data;
      sVar14 = (this->weight_data_tm).elemsize;
      sVar11 = (this->weight_data_tm).cstep;
      pvVar15 = (this->weight_data_tm).data;
      iVar73 = uVar72 * _h;
      iVar28 = iVar73 * 4;
      for (; (long)(uVar80 | 3) < (long)uVar65; uVar80 = uVar80 + 4) {
        pvVar34 = (void *)((long)pvVar10 + (long)iVar82 * 4);
        pvVar40 = (void *)((long)pvVar10 + (long)iVar61 * 4);
        pvVar50 = (void *)((long)pvVar10 + (long)iVar78 * 4);
        pvVar63 = (void *)((long)pvVar10 + (long)iVar83 * 4);
        puVar32 = (undefined4 *)
                  ((ulong)(((uint)(uVar80 >> 3) & 0x1fffffff) + (uint)(((uint)uVar80 >> 2 & 1) != 0)
                          ) * sVar14 * sVar11 + (long)pvVar15);
        lVar47 = 0;
        pvVar71 = pvVar63;
        pvVar77 = pvVar50;
        pvVar81 = pvVar34;
        pvVar87 = pvVar40;
        for (uVar55 = 0; (int)(uVar55 | 7) < (int)_h; uVar55 = uVar55 + 8) {
          lVar48 = lVar47;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar53 = lVar48;
            for (lVar54 = 0; (int)lVar54 != 0x80; lVar54 = lVar54 + 0x10) {
              *(undefined4 *)((long)puVar32 + lVar54) = *(undefined4 *)((long)pvVar34 + lVar53);
              *(undefined4 *)((long)puVar32 + lVar54 + 4) = *(undefined4 *)((long)pvVar40 + lVar53);
              *(undefined4 *)((long)puVar32 + lVar54 + 8) = *(undefined4 *)((long)pvVar50 + lVar53);
              *(undefined4 *)((long)puVar32 + lVar54 + 0xc) =
                   *(undefined4 *)((long)pvVar63 + lVar53);
              lVar53 = lVar53 + lVar79;
            }
            puVar32 = (undefined4 *)((long)puVar32 + lVar54);
            lVar48 = lVar48 + 4;
          }
          lVar47 = lVar47 + lVar69;
          pvVar81 = (void *)((long)pvVar81 + lVar69);
          pvVar87 = (void *)((long)pvVar87 + lVar69);
          pvVar77 = (void *)((long)pvVar77 + lVar69);
          pvVar71 = (void *)((long)pvVar71 + lVar69);
        }
        for (; (int)(uVar55 | 3) < (int)_h; uVar55 = uVar55 + 4) {
          pvVar34 = pvVar71;
          pvVar40 = pvVar77;
          pvVar50 = pvVar81;
          pvVar63 = pvVar87;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar48 = 0;
            for (lVar47 = 0; (int)lVar47 != 0x40; lVar47 = lVar47 + 0x10) {
              *(undefined4 *)((long)puVar32 + lVar47) = *(undefined4 *)((long)pvVar50 + lVar48);
              *(undefined4 *)((long)puVar32 + lVar47 + 4) = *(undefined4 *)((long)pvVar63 + lVar48);
              *(undefined4 *)((long)puVar32 + lVar47 + 8) = *(undefined4 *)((long)pvVar40 + lVar48);
              *(undefined4 *)((long)puVar32 + lVar47 + 0xc) =
                   *(undefined4 *)((long)pvVar34 + lVar48);
              lVar48 = lVar48 + lVar79;
            }
            puVar32 = (undefined4 *)((long)puVar32 + lVar47);
            pvVar50 = (void *)((long)pvVar50 + 4);
            pvVar63 = (void *)((long)pvVar63 + 4);
            pvVar40 = (void *)((long)pvVar40 + 4);
            pvVar34 = (void *)((long)pvVar34 + 4);
          }
          pvVar81 = (void *)((long)pvVar81 + lVar1);
          pvVar87 = (void *)((long)pvVar87 + lVar1);
          pvVar77 = (void *)((long)pvVar77 + lVar1);
          pvVar71 = (void *)((long)pvVar71 + lVar1);
        }
        for (; (int)(uVar55 | 1) < (int)_h; uVar55 = uVar55 + 2) {
          pvVar34 = pvVar71;
          pvVar40 = pvVar77;
          pvVar50 = pvVar81;
          pvVar63 = pvVar87;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar48 = 0;
            for (lVar47 = 0; (int)lVar47 != 0x20; lVar47 = lVar47 + 0x10) {
              *(undefined4 *)((long)puVar32 + lVar47) = *(undefined4 *)((long)pvVar50 + lVar48);
              *(undefined4 *)((long)puVar32 + lVar47 + 4) = *(undefined4 *)((long)pvVar63 + lVar48);
              *(undefined4 *)((long)puVar32 + lVar47 + 8) = *(undefined4 *)((long)pvVar40 + lVar48);
              *(undefined4 *)((long)puVar32 + lVar47 + 0xc) =
                   *(undefined4 *)((long)pvVar34 + lVar48);
              lVar48 = lVar48 + lVar79;
            }
            puVar32 = (undefined4 *)((long)puVar32 + lVar47);
            pvVar50 = (void *)((long)pvVar50 + 4);
            pvVar63 = (void *)((long)pvVar63 + 4);
            pvVar40 = (void *)((long)pvVar40 + 4);
            pvVar34 = (void *)((long)pvVar34 + 4);
          }
          pvVar81 = (void *)((long)pvVar81 + lVar57);
          pvVar87 = (void *)((long)pvVar87 + lVar57);
          pvVar77 = (void *)((long)pvVar77 + lVar57);
          pvVar71 = (void *)((long)pvVar71 + lVar57);
        }
        for (; (int)uVar55 < (int)_h; uVar55 = uVar55 + 1) {
          for (uVar86 = 0; uVar46 != uVar86; uVar86 = uVar86 + 1) {
            *puVar32 = *(undefined4 *)((long)pvVar81 + uVar86 * 4);
            puVar32[1] = *(undefined4 *)((long)pvVar87 + uVar86 * 4);
            puVar32[2] = *(undefined4 *)((long)pvVar77 + uVar86 * 4);
            puVar32[3] = *(undefined4 *)((long)pvVar71 + uVar86 * 4);
            puVar32 = puVar32 + 4;
          }
        }
        iVar82 = iVar82 + iVar28;
        iVar61 = iVar61 + iVar28;
        iVar78 = iVar78 + iVar28;
        iVar83 = iVar83 + iVar28;
      }
      pvVar10 = (this->super_Convolution).weight_data.data;
      pvVar15 = (this->weight_data_tm).data;
      sVar14 = (this->weight_data_tm).elemsize;
      sVar11 = (this->weight_data_tm).cstep;
      local_c0 = (void *)((long)pvVar10 + local_d8 * 4);
      local_c8 = (void *)((long)pvVar10 + (long)(int)(uVar72 * 3) * 4);
      local_d0 = (void *)((long)pvVar10 + lVar33 * 4);
      for (; (long)(uVar80 | 1) < (long)uVar65; uVar80 = uVar80 + 2) {
        lVar48 = (long)iVar61;
        local_1f0 = (void *)((long)pvVar10 + lVar48 * 4 + (long)(int)(uVar72 * 7) * 4);
        local_230 = (void *)((long)pvVar10 + lVar48 * 4 + (long)(int)(uVar72 * 6) * 4);
        local_240 = (void *)((long)pvVar10 + lVar48 * 4 + (long)(int)(uVar72 * 5) * 4);
        local_228 = (void *)((long)local_c0 + lVar48 * 4);
        pvVar63 = (void *)((long)local_c8 + lVar48 * 4);
        pvVar71 = (void *)((long)local_d0 + lVar48 * 4);
        lVar47 = (long)pvVar10 + lVar48 * 4 + local_a0 * 4;
        pvVar34 = (void *)((long)pvVar10 + lVar48 * 4);
        lVar54 = (long)iVar82;
        local_208 = (void *)((long)pvVar10 + lVar54 * 4 + (long)(int)(uVar72 * 7) * 4);
        local_210 = (void *)((long)pvVar10 + lVar54 * 4 + (long)(int)(uVar72 * 6) * 4);
        lVar48 = (long)pvVar10 + lVar54 * 4 + (long)(int)(uVar72 * 5) * 4;
        pvVar40 = (void *)((long)local_c0 + lVar54 * 4);
        pvVar81 = (void *)(lVar54 * 4 + (long)local_c8);
        pvVar77 = (void *)((long)local_d0 + lVar54 * 4);
        lVar53 = (long)pvVar10 + lVar54 * 4 + local_a0 * 4;
        pvVar50 = (void *)((long)pvVar10 + lVar54 * 4);
        puVar32 = (undefined4 *)
                  ((ulong)(((uint)uVar80 >> 2 & 1) + ((uint)(uVar80 >> 3) & 0x1fffffff) +
                          (uint)(((uint)uVar80 >> 1 & 1) != 0)) * sVar14 * sVar11 + (long)pvVar15);
        for (uVar55 = 0; (int)(uVar55 | 7) < (int)_h; uVar55 = uVar55 + 8) {
          for (lVar54 = 0; lVar66 != lVar54; lVar54 = lVar54 + 4) {
            *puVar32 = *(undefined4 *)((long)pvVar50 + lVar54);
            puVar32[1] = *(undefined4 *)(lVar53 + lVar54);
            puVar32[2] = *(undefined4 *)((long)pvVar77 + lVar54);
            puVar32[3] = *(undefined4 *)((long)pvVar81 + lVar54);
            puVar32[4] = *(undefined4 *)((long)pvVar40 + lVar54);
            puVar32[5] = *(undefined4 *)(lVar48 + lVar54);
            puVar32[6] = *(undefined4 *)((long)local_210 + lVar54);
            puVar32[7] = *(undefined4 *)((long)local_208 + lVar54);
            puVar32[8] = *(undefined4 *)((long)pvVar34 + lVar54);
            puVar32[9] = *(undefined4 *)(lVar47 + lVar54);
            puVar32[10] = *(undefined4 *)((long)pvVar71 + lVar54);
            puVar32[0xb] = *(undefined4 *)((long)pvVar63 + lVar54);
            puVar32[0xc] = *(undefined4 *)((long)local_228 + lVar54);
            puVar32[0xd] = *(undefined4 *)((long)local_240 + lVar54);
            puVar32[0xe] = *(undefined4 *)((long)local_230 + lVar54);
            puVar32[0xf] = *(undefined4 *)((long)local_1f0 + lVar54);
            puVar32 = puVar32 + 0x10;
          }
          pvVar50 = (void *)((long)pvVar50 + lVar69);
          pvVar34 = (void *)((long)pvVar34 + lVar69);
          local_1f0 = (void *)((long)local_1f0 + lVar69);
          local_230 = (void *)((long)local_230 + lVar69);
          local_240 = (void *)((long)local_240 + lVar69);
          local_228 = (void *)((long)local_228 + lVar69);
          pvVar63 = (void *)((long)pvVar63 + lVar69);
          pvVar71 = (void *)((long)pvVar71 + lVar69);
          lVar47 = lVar47 + lVar69;
          local_208 = (void *)((long)local_208 + lVar69);
          local_210 = (void *)((long)local_210 + lVar69);
          lVar48 = lVar48 + lVar69;
          pvVar40 = (void *)((long)pvVar40 + lVar69);
          pvVar81 = (void *)((long)pvVar81 + lVar69);
          pvVar77 = (void *)((long)pvVar77 + lVar69);
          lVar53 = lVar53 + lVar69;
        }
        for (; (int)(uVar55 | 3) < (int)_h; uVar55 = uVar55 + 4) {
          puVar52 = puVar32;
          for (lVar48 = 0; lVar66 != lVar48; lVar48 = lVar48 + 4) {
            puVar32[lVar48 * 2] = *(undefined4 *)((long)pvVar50 + lVar48);
            puVar32[lVar48 * 2 + 1] = *(undefined4 *)(lVar53 + lVar48);
            puVar32[lVar48 * 2 + 2] = *(undefined4 *)((long)pvVar77 + lVar48);
            puVar32[lVar48 * 2 + 3] = *(undefined4 *)((long)pvVar81 + lVar48);
            puVar32[lVar48 * 2 + 4] = *(undefined4 *)((long)pvVar34 + lVar48);
            puVar32[lVar48 * 2 + 5] = *(undefined4 *)(lVar47 + lVar48);
            puVar32[lVar48 * 2 + 6] = *(undefined4 *)((long)pvVar71 + lVar48);
            puVar32[lVar48 * 2 + 7] = *(undefined4 *)((long)pvVar63 + lVar48);
            puVar52 = puVar52 + 8;
          }
          pvVar50 = (void *)((long)pvVar50 + lVar1);
          pvVar34 = (void *)((long)pvVar34 + lVar1);
          pvVar63 = (void *)((long)pvVar63 + lVar1);
          pvVar71 = (void *)((long)pvVar71 + lVar1);
          lVar47 = lVar47 + lVar1;
          pvVar81 = (void *)((long)pvVar81 + lVar1);
          pvVar77 = (void *)((long)pvVar77 + lVar1);
          lVar53 = lVar53 + lVar1;
          puVar32 = puVar52;
        }
        for (; (int)(uVar55 | 1) < (int)_h; uVar55 = uVar55 + 2) {
          pvVar40 = pvVar34;
          pvVar63 = pvVar50;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            lVar48 = 0;
            for (lVar47 = 0; (int)lVar47 != 0x10; lVar47 = lVar47 + 8) {
              *(undefined4 *)((long)puVar32 + lVar47) = *(undefined4 *)((long)pvVar63 + lVar48);
              *(undefined4 *)((long)puVar32 + lVar47 + 4) = *(undefined4 *)((long)pvVar40 + lVar48);
              lVar48 = lVar48 + lVar79;
            }
            puVar32 = (undefined4 *)((long)puVar32 + lVar47);
            pvVar63 = (void *)((long)pvVar63 + 4);
            pvVar40 = (void *)((long)pvVar40 + 4);
          }
          pvVar50 = (void *)((long)pvVar50 + lVar57);
          pvVar34 = (void *)((long)pvVar34 + lVar57);
        }
        for (; (int)uVar55 < (int)_h; uVar55 = uVar55 + 1) {
          for (uVar86 = 0; uVar46 != uVar86; uVar86 = uVar86 + 1) {
            *puVar32 = *(undefined4 *)((long)pvVar50 + uVar86 * 4);
            puVar32[1] = *(undefined4 *)((long)pvVar34 + uVar86 * 4);
            puVar32 = puVar32 + 2;
          }
        }
        iVar82 = iVar82 + iVar73 * 2;
        iVar61 = iVar61 + iVar73 * 2;
      }
      pvVar10 = (this->super_Convolution).weight_data.data;
      pvVar15 = (this->weight_data_tm).data;
      sVar14 = (this->weight_data_tm).elemsize;
      sVar11 = (this->weight_data_tm).cstep;
      for (; (long)uVar80 < (long)uVar65; uVar80 = uVar80 + 1) {
        lVar79 = (long)pvVar10 + (long)iVar82 * 4 + local_a0 * 4;
        puVar32 = (undefined4 *)((long)pvVar10 + (long)iVar82 * 4);
        puVar52 = (undefined4 *)
                  ((ulong)(((uint)uVar80 & 1) + ((uint)(uVar80 >> 3) & 0x1fffffff) +
                           ((uint)(uVar80 >> 2) & 1) + (uint)(((uint)uVar80 >> 1 & 1) != 0)) *
                   sVar14 * sVar11 + (long)pvVar15);
        for (uVar55 = 0; (int)(uVar55 | 7) < (int)_h; uVar55 = uVar55 + 8) {
          puVar35 = puVar32;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            puVar88 = puVar35;
            for (lVar47 = 0; (int)lVar47 != 0x20; lVar47 = lVar47 + 4) {
              *(undefined4 *)((long)puVar52 + lVar47) = *puVar88;
              puVar88 = puVar88 + local_a0;
            }
            puVar52 = (undefined4 *)((long)puVar52 + lVar47);
            puVar35 = puVar35 + 1;
          }
          puVar32 = puVar32 + (int)(uVar72 * 8);
          lVar79 = lVar79 + lVar69;
        }
        for (; (int)(uVar55 | 3) < (int)_h; uVar55 = uVar55 + 4) {
          puVar35 = puVar32;
          for (uVar86 = 0; uVar86 != uVar46; uVar86 = uVar86 + 1) {
            puVar88 = puVar35;
            for (lVar47 = 0; (int)lVar47 != 0x10; lVar47 = lVar47 + 4) {
              *(undefined4 *)((long)puVar52 + lVar47) = *puVar88;
              puVar88 = puVar88 + local_a0;
            }
            puVar52 = (undefined4 *)((long)puVar52 + lVar47);
            puVar35 = puVar35 + 1;
          }
          puVar32 = puVar32 + local_d8;
          lVar79 = lVar79 + lVar1;
        }
        for (; (int)(uVar55 | 1) < (int)_h; uVar55 = uVar55 + 2) {
          for (uVar86 = 0; uVar46 != uVar86; uVar86 = uVar86 + 1) {
            *puVar52 = puVar32[uVar86];
            puVar52[1] = *(undefined4 *)(lVar79 + uVar86 * 4);
            puVar52 = puVar52 + 2;
          }
          puVar32 = puVar32 + lVar33;
          lVar79 = lVar79 + lVar57;
        }
        for (; (int)uVar55 < (int)_h; uVar55 = uVar55 + 1) {
          for (lVar79 = 0; lVar66 != lVar79; lVar79 = lVar79 + 4) {
            *(undefined4 *)((long)puVar52 + lVar79) = *(undefined4 *)((long)puVar32 + lVar79);
          }
          puVar52 = (undefined4 *)((long)puVar52 + lVar79);
        }
        iVar82 = iVar82 + iVar73;
      }
    }
    cVar7 = opt->lightmode;
    goto joined_r0x001e5401;
  }
  pMVar9 = (this->super_Convolution).super_Layer.bottom_shapes.
           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (((pMVar9 == (this->super_Convolution).super_Layer.bottom_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish) || (pMVar9->w == 0)) || (pMVar9->h == 0)) {
    pMVar38 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar45 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (((pMVar38 != pMVar45) && (pMVar38->w != 0)) && (pMVar38->h != 0)) goto LAB_001e402f;
    if ((((int)uVar55 < 0x21) && (opt->use_winograd63_convolution != false)) && ((int)_h < 0x21)) {
LAB_001e4954:
      conv3x3s1_winograd63_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,_h,uVar55,opt)
      ;
    }
    else {
      if (opt->use_winograd43_convolution != true) goto LAB_001e4932;
LAB_001e4903:
      conv3x3s1_winograd43_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,_h,uVar55,opt)
      ;
    }
  }
  else {
    pMVar38 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar45 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
LAB_001e402f:
    if (((pMVar38 == pMVar45) || (iVar82 = pMVar38->w, iVar82 == 0)) ||
       (iVar73 = pMVar38->h, iVar73 == 0)) {
      iVar82 = pMVar9->w;
      iVar73 = pMVar9->h;
      uVar46._0_4_ = (this->super_Convolution).pad_left;
      uVar46._4_4_ = (this->super_Convolution).pad_right;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar46;
      auVar89 = vpcmpgtd_avx(auVar90,(undefined1  [16])0x0);
      auVar89 = vpmovsxdq_avx(auVar89);
      if ((((auVar89 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar89[0xf])
          && (iVar28 = (this->super_Convolution).pad_top, iVar28 < 1)) &&
         (iVar29 = (this->super_Convolution).pad_bottom, iVar29 < 1)) {
        auVar89 = vpinsrd_avx(auVar90,iVar28,2);
        auVar89 = vpinsrd_avx(auVar89,iVar29,3);
        auVar91._8_4_ = 0xffffff17;
        auVar91._0_8_ = 0xffffff17ffffff17;
        auVar91._12_4_ = 0xffffff17;
        if (auVar89 != auVar91) {
          auVar92._8_4_ = 0xffffff16;
          auVar92._0_8_ = 0xffffff16ffffff16;
          auVar92._12_4_ = 0xffffff16;
          auVar89 = vpcmpeqd_avx(auVar89,auVar92);
          uVar37 = vmovmskps_avx(auVar89);
          if ((char)uVar37 != '\x0f') goto LAB_001e44ba;
        }
        goto LAB_001e4052;
      }
      iVar82 = iVar82 + uVar46._4_4_ + (undefined4)uVar46;
      iVar73 = iVar73 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom;
    }
    else {
LAB_001e4052:
      iVar82 = iVar82 + 2;
      iVar73 = iVar73 + 2;
    }
LAB_001e44ba:
    bVar26 = test_prefer_winograd63(_h,uVar55,iVar82,iVar73);
    bVar41 = test_prefer_winograd23(_h,uVar55,iVar82,iVar73);
    bVar36 = bVar41 & bVar42;
    if (!bVar41) {
      bVar42 = bVar26;
    }
    if ((bool)bVar26) {
      bVar27 = opt->use_winograd63_convolution;
      if ((bVar42 & bVar27) == 0) goto LAB_001e48da;
LAB_001e4831:
      if (bVar36 == 0) {
LAB_001e493f:
        if (bVar26 != 0) goto LAB_001e4954;
        goto LAB_001e495f;
      }
    }
    else {
      if (bVar42 != 0) goto LAB_001e4831;
      bVar27 = 0;
LAB_001e48da:
      if (opt->use_winograd43_convolution == false) {
        if (bVar36 != 0 || opt->use_winograd63_convolution != true) goto LAB_001e4932;
        bVar26 = bVar27 | opt->use_winograd63_convolution;
        goto LAB_001e493f;
      }
      if (bVar36 == 0) goto LAB_001e4903;
    }
LAB_001e4932:
    conv3x3s1_winograd23_transform_kernel
              (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,_h,uVar55,opt);
  }
LAB_001e495f:
  cVar7 = opt->lightmode;
joined_r0x001e5401:
  if (cVar7 == '\x01') {
    piVar12 = (this->super_Convolution).weight_data.refcount;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        pAVar13 = (this->super_Convolution).weight_data.allocator;
        if (pAVar13 == (Allocator *)0x0) {
          free((this->super_Convolution).weight_data.data);
        }
        else {
          (*pAVar13->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_Convolution).weight_data.data = (void *)0x0;
    (this->super_Convolution).weight_data.refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}